

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ReadNodeTransformation(ColladaParser *this,Node *pNode,TransformType pType)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ai_real *out;
  uint a;
  ulong uVar3;
  char *content;
  Node *local_c0;
  string tagName;
  Transform tf;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string
              ((string *)&tagName,(char *)CONCAT44(extraout_var,iVar1),(allocator *)&tf);
    tf.mID._M_dataplus._M_p = (pointer)&tf.mID.field_2;
    tf.mID._M_string_length = 0;
    tf.mID.field_2._M_local_buf[0] = '\0';
    tf.mType = pType;
    uVar2 = TestAttribute(this,"sid");
    if (-1 < (int)uVar2) {
      (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
      std::__cxx11::string::assign((char *)&tf);
    }
    local_c0 = pNode;
    content = GetTextContent(this);
    uVar2 = ReadNodeTransformation::sNumParameters[pType];
    out = tf.f;
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      content = fast_atoreal_move<float>(content,out,true);
      SkipSpacesAndLineEnd<char>(&content);
      out = out + 1;
    }
    std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::push_back
              (&local_c0->mTransforms,&tf);
    TestClosing(this,tagName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&tf);
    std::__cxx11::string::~string((string *)&tagName);
  }
  return;
}

Assistant:

void ColladaParser::ReadNodeTransformation(Node* pNode, TransformType pType)
{
    if (mReader->isEmptyElement())
        return;

    std::string tagName = mReader->getNodeName();

    Transform tf;
    tf.mType = pType;

    // read SID
    int indexSID = TestAttribute("sid");
    if (indexSID >= 0)
        tf.mID = mReader->getAttributeValue(indexSID);

    // how many parameters to read per transformation type
    static const unsigned int sNumParameters[] = { 9, 4, 3, 3, 7, 16 };
    const char* content = GetTextContent();

    // read as many parameters and store in the transformation
    for (unsigned int a = 0; a < sNumParameters[pType]; a++)
    {
        // read a number
        content = fast_atoreal_move<ai_real>(content, tf.f[a]);
        // skip whitespace after it
        SkipSpacesAndLineEnd(&content);
    }

    // place the transformation at the queue of the node
    pNode->mTransforms.push_back(tf);

    // and consume the closing tag
    TestClosing(tagName.c_str());
}